

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O1

MessageType __thiscall
cmMakefile::ExpandVariablesInStringOld
          (cmMakefile *this,string *errorstr,string *source,bool escapeQuotes,bool noEscapes,
          bool atOnly,char *filename,long line,bool removeEmpty,bool replaceAt)

{
  char *pcVar1;
  char *pcVar2;
  char *pcVar3;
  bool bVar4;
  int iVar5;
  PolicyStatus PVar6;
  long lVar7;
  string *psVar8;
  size_t sVar9;
  ostream *poVar10;
  undefined7 in_register_00000009;
  PolicyID id;
  PolicyID id_00;
  MessageType MVar11;
  pointer pcVar12;
  _func_int **string;
  string input;
  cmCommandArgumentParserHelper parser;
  string *local_2c8;
  string local_2c0;
  cmMakefile *local_2a0;
  undefined4 local_294;
  string local_290;
  RegularExpression *local_270;
  undefined1 local_268 [16];
  _func_int *local_258 [12];
  ios_base local_1f8 [264];
  undefined1 local_f0 [128];
  _Alloc_hider local_70;
  bool local_38;
  bool local_37;
  bool local_36;
  bool local_35;
  
  local_294 = (undefined4)CONCAT71(in_register_00000009,escapeQuotes);
  local_2c8 = source;
  local_2a0 = this;
  lVar7 = std::__cxx11::string::find_first_of((char *)source,0x4da99e,0);
  psVar8 = local_2c8;
  if (lVar7 == -1) {
    return LOG;
  }
  if (atOnly) {
    local_268._0_8_ = local_258;
    pcVar12 = (local_2c8->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_268,pcVar12,pcVar12 + local_2c8->_M_string_length);
    psVar8->_M_string_length = 0;
    *(psVar8->_M_dataplus)._M_p = '\0';
    local_270 = &local_2a0->cmAtVarRegex;
    string = (_func_int **)local_268._0_8_;
    while (bVar4 = cmsys::RegularExpression::find(local_270,(char *)string,&local_270->regmatch),
          bVar4) {
      pcVar1 = (local_2a0->cmAtVarRegex).regmatch.searchstring;
      pcVar2 = (local_2a0->cmAtVarRegex).regmatch.startp[0];
      pcVar3 = (local_2a0->cmAtVarRegex).regmatch.endp[0];
      std::__cxx11::string::append((char *)local_2c8,(ulong)string);
      lVar7 = (long)pcVar3 - (long)pcVar1;
      local_f0._0_8_ = local_f0 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_f0,(char *)((long)string + (long)(pcVar2 + (1 - (long)pcVar1))),
                 (long)string + lVar7 + -1);
      psVar8 = GetDef(local_2a0,(string *)local_f0);
      if (psVar8 == (string *)0x0) {
        pcVar12 = (char *)0x0;
      }
      else {
        pcVar12 = (psVar8->_M_dataplus)._M_p;
      }
      if (pcVar12 != (char *)0x0) {
        if ((char)local_294 == '\0') {
          std::__cxx11::string::append((char *)local_2c8);
        }
        else {
          local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
          sVar9 = strlen(pcVar12);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_290,pcVar12,pcVar12 + sVar9);
          cmSystemTools::EscapeQuotes(&local_2c0,&local_290);
          std::__cxx11::string::_M_append((char *)local_2c8,(ulong)local_2c0._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
            operator_delete(local_2c0._M_dataplus._M_p,local_2c0.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_290._M_dataplus._M_p != &local_290.field_2) {
            operator_delete(local_290._M_dataplus._M_p,local_290.field_2._M_allocated_capacity + 1);
          }
        }
      }
      if ((undefined1 *)local_f0._0_8_ != local_f0 + 0x10) {
        operator_delete((void *)local_f0._0_8_,local_f0._16_8_ + 1);
      }
      string = (_func_int **)((long)string + lVar7);
    }
    std::__cxx11::string::append((char *)local_2c8);
    if ((_func_int **)local_268._0_8_ == local_258) {
      return LOG;
    }
    operator_delete((void *)local_268._0_8_,(ulong)(local_258[0] + 1));
    return LOG;
  }
  cmCommandArgumentParserHelper::cmCommandArgumentParserHelper
            ((cmCommandArgumentParserHelper *)local_f0);
  cmCommandArgumentParserHelper::SetMakefile((cmCommandArgumentParserHelper *)local_f0,local_2a0);
  cmCommandArgumentParserHelper::SetLineFile
            ((cmCommandArgumentParserHelper *)local_f0,line,filename);
  local_38 = SUB41(local_294,0);
  local_36 = replaceAt;
  local_35 = removeEmpty;
  local_37 = noEscapes;
  iVar5 = cmCommandArgumentParserHelper::ParseString
                    ((cmCommandArgumentParserHelper *)local_f0,(local_2c8->_M_dataplus)._M_p,0);
  if ((iVar5 != 0) && (*local_70._M_p == '\0')) {
    MVar11 = LOG;
    std::__cxx11::string::_M_assign((string *)local_2c8);
    goto LAB_0014f6f6;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_268);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_268,"Syntax error in cmake code ",0x1b);
  if (0 < line && filename != (char *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_268,"at\n",3);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_268,"  ",2);
    sVar9 = strlen(filename);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_268,filename,sVar9);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_268,":",1);
    poVar10 = std::ostream::_M_insert<long>((long)local_268);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_268,"when parsing string\n",0x14);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_268,"  ",2);
  poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_268,(local_2c8->_M_dataplus)._M_p,
                       local_2c8->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
  if (local_70._M_p == (char *)0x0) {
    std::ios::clear((int)(_func_int *)
                         ((long)&local_2c8 + (long)*(_func_int **)(local_268._0_8_ + -0x18)) + 0x60)
    ;
  }
  else {
    sVar9 = strlen(local_70._M_p);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_268,local_70._M_p,sVar9);
  }
  MVar11 = FATAL_ERROR;
  if (iVar5 == 0) {
    PVar6 = cmStateSnapshot::GetPolicy(&local_2a0->StateSnapshot,CMP0010,false);
    if (PVar6 - REQUIRED_IF_USED < 2) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_268,"\n",1);
      cmPolicies::GetRequiredPolicyError_abi_cxx11_(&local_2c0,(cmPolicies *)0xa,id_00);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_268,local_2c0._M_dataplus._M_p,local_2c0._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
        operator_delete(local_2c0._M_dataplus._M_p,local_2c0.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      if (PVar6 != OLD) {
        if (PVar6 != WARN) goto LAB_0014f5f8;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_268,"\n",1);
        cmPolicies::GetPolicyWarning_abi_cxx11_(&local_2c0,(cmPolicies *)0xa,id);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_268,local_2c0._M_dataplus._M_p,local_2c0._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
          operator_delete(local_2c0._M_dataplus._M_p,local_2c0.field_2._M_allocated_capacity + 1);
        }
      }
      MVar11 = AUTHOR_WARNING;
    }
  }
LAB_0014f5f8:
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)errorstr,(string *)&local_2c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
    operator_delete(local_2c0._M_dataplus._M_p,local_2c0.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_268);
  std::ios_base::~ios_base(local_1f8);
LAB_0014f6f6:
  cmCommandArgumentParserHelper::~cmCommandArgumentParserHelper
            ((cmCommandArgumentParserHelper *)local_f0);
  return MVar11;
}

Assistant:

MessageType cmMakefile::ExpandVariablesInStringOld(
  std::string& errorstr, std::string& source, bool escapeQuotes,
  bool noEscapes, bool atOnly, const char* filename, long line,
  bool removeEmpty, bool replaceAt) const
{
  // Fast path strings without any special characters.
  if (source.find_first_of("$@\\") == std::string::npos) {
    return MessageType::LOG;
  }

  // Special-case the @ONLY mode.
  if (atOnly) {
    // Store an original copy of the input.
    std::string input = source;

    // Start with empty output.
    source.clear();

    // Look for one @VAR@ at a time.
    const char* in = input.c_str();
    while (this->cmAtVarRegex.find(in)) {
      // Get the range of the string to replace.
      const char* first = in + this->cmAtVarRegex.start();
      const char* last = in + this->cmAtVarRegex.end();

      // Store the unchanged part of the string now.
      source.append(in, first - in);

      // Lookup the definition of VAR.
      std::string var(first + 1, last - first - 2);
      if (const char* val = this->GetDefinition(var)) {
        // Store the value in the output escaping as requested.
        if (escapeQuotes) {
          source.append(cmSystemTools::EscapeQuotes(val));
        } else {
          source.append(val);
        }
      }

      // Continue looking for @VAR@ further along the string.
      in = last;
    }

    // Append the rest of the unchanged part of the string.
    source.append(in);

    return MessageType::LOG;
  }

  // This method replaces ${VAR} and @VAR@ where VAR is looked up
  // with GetDefinition(), if not found in the map, nothing is expanded.
  // It also supports the $ENV{VAR} syntax where VAR is looked up in
  // the current environment variables.

  cmCommandArgumentParserHelper parser;
  parser.SetMakefile(this);
  parser.SetLineFile(line, filename);
  parser.SetEscapeQuotes(escapeQuotes);
  parser.SetNoEscapeMode(noEscapes);
  parser.SetReplaceAtSyntax(replaceAt);
  parser.SetRemoveEmpty(removeEmpty);
  int res = parser.ParseString(source.c_str(), 0);
  const char* emsg = parser.GetError();
  MessageType mtype = MessageType::LOG;
  if (res && !emsg[0]) {
    source = parser.GetResult();
  } else {
    // Construct the main error message.
    std::ostringstream error;
    error << "Syntax error in cmake code ";
    if (filename && line > 0) {
      // This filename and line number may be more specific than the
      // command context because one command invocation can have
      // arguments on multiple lines.
      error << "at\n"
            << "  " << filename << ":" << line << "\n";
    }
    error << "when parsing string\n"
          << "  " << source << "\n";
    error << emsg;

    // If the parser failed ("res" is false) then this is a real
    // argument parsing error, so the policy applies.  Otherwise the
    // parser reported an error message without failing because the
    // helper implementation is unhappy, which has always reported an
    // error.
    mtype = MessageType::FATAL_ERROR;
    if (!res) {
      // This is a real argument parsing error.  Use policy CMP0010 to
      // decide whether it is an error.
      switch (this->GetPolicyStatus(cmPolicies::CMP0010)) {
        case cmPolicies::WARN:
          error << "\n" << cmPolicies::GetPolicyWarning(cmPolicies::CMP0010);
          CM_FALLTHROUGH;
        case cmPolicies::OLD:
          // OLD behavior is to just warn and continue.
          mtype = MessageType::AUTHOR_WARNING;
          break;
        case cmPolicies::REQUIRED_IF_USED:
        case cmPolicies::REQUIRED_ALWAYS:
          error << "\n"
                << cmPolicies::GetRequiredPolicyError(cmPolicies::CMP0010);
        case cmPolicies::NEW:
          // NEW behavior is to report the error.
          break;
      }
    }
    errorstr = error.str();
  }
  return mtype;
}